

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_copySequencesToSeqStoreNoBlockDelim
                 (ZSTD_CCtx *cctx,ZSTD_sequencePosition *seqPos,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t blockSize,ZSTD_paramSwitch_e externalRepSearch)

{
  BYTE **ppBVar1;
  ZSTD_CDict *pZVar2;
  ZSTD_compressedBlockState_t *pZVar3;
  BYTE *pBVar4;
  undefined8 uVar5;
  uint uVar6;
  ulong uVar7;
  seqDef *psVar8;
  BYTE *pBVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  U32 UVar23;
  uint uVar24;
  uint uVar25;
  uint local_ac;
  uint local_a8;
  uint local_a0;
  undefined8 local_98;
  uint local_90;
  int local_88;
  uint local_84;
  BYTE *local_80;
  uint local_74;
  ZSTD_sequencePosition *local_70;
  size_t local_68;
  size_t local_60;
  long local_58;
  BYTE *local_50;
  ZSTD_Sequence *local_48;
  size_t local_40;
  ulong local_38;
  
  local_40 = inSeqsSize;
  local_48 = inSeqs;
  local_60 = blockSize;
  uVar25 = (int)blockSize + seqPos->posInSequence;
  pZVar2 = cctx->cdict;
  if (pZVar2 == (ZSTD_CDict *)0x0) {
    if ((cctx->prefixDict).dict == (void *)0x0) {
      local_68 = 0;
      goto LAB_01d25baf;
    }
    pZVar2 = (ZSTD_CDict *)&cctx->prefixDict;
  }
  local_68 = pZVar2->dictContentSize;
LAB_01d25baf:
  UVar23 = seqPos->idx;
  pZVar3 = (cctx->blockState).prevCBlock;
  local_a0 = pZVar3->rep[2];
  local_90 = local_a0;
  local_98 = *(undefined8 *)pZVar3->rep;
  uVar5 = local_98;
  local_58 = (long)src + blockSize;
  if (uVar25 == 0) {
    uVar22 = 0;
    uVar14 = 0;
  }
  else {
    local_98._4_4_ = (uint)((ulong)local_98 >> 0x20);
    local_84 = local_98._4_4_;
    pBVar9 = (BYTE *)((long)src + blockSize + -0x20);
    local_ac = 0;
    local_80 = pBVar9;
    local_70 = seqPos;
    uVar10 = (ulong)seqPos->posInSequence;
    uVar24 = (uint)local_98;
    iVar21 = 0;
    local_98 = uVar5;
    do {
      uVar22 = uVar25;
      uVar14 = local_ac;
      if ((iVar21 != 0) || (uVar12 = (ulong)UVar23, local_40 <= uVar12)) goto LAB_01d25fb7;
      uVar6 = local_48[uVar12].offset;
      uVar11 = local_48[uVar12].litLength;
      uVar18 = local_48[uVar12].matchLength;
      local_a8 = uVar11 + uVar18;
      uVar19 = local_a8 - uVar25;
      local_74 = local_a8;
      uVar20 = (uint)uVar10;
      if (local_a8 < uVar25 || uVar19 == 0) {
        uVar17 = uVar11 - uVar20;
        if (uVar11 < uVar20) {
          uVar17 = 0;
        }
        iVar21 = uVar20 - uVar11;
        local_88 = 0;
        if (uVar20 < uVar11) {
          iVar21 = 0;
        }
        uVar18 = uVar18 - iVar21;
        uVar10 = 0;
      }
      else {
        uVar13 = uVar25 - uVar11;
        if (uVar25 < uVar11 || uVar13 == 0) goto LAB_01d25fb7;
        uVar17 = uVar11 - uVar20;
        if (uVar11 < uVar20) {
          uVar17 = 0;
        }
        uVar22 = uVar11;
        uVar14 = uVar13;
        if (uVar18 <= local_60) goto LAB_01d25fb7;
        uVar18 = (uVar25 - uVar20) - uVar17;
        uVar11 = (cctx->appliedParams).cParams.minMatch;
        if (uVar18 < uVar11) goto LAB_01d25fb7;
        local_a8 = uVar11 - uVar19;
        if (uVar11 >= uVar19 && local_a8 != 0) {
          local_ac = local_a8;
        }
        if (uVar11 < uVar19) {
          local_a8 = 0;
        }
        uVar18 = uVar18 - local_a8;
        local_88 = 1;
        pBVar9 = local_80;
      }
      if ((uVar17 == 0) || (uVar22 = 1, uVar24 != uVar6)) {
        if (local_84 == uVar6) {
          iVar21 = 2;
LAB_01d25d13:
          uVar22 = iVar21 - (uint)(uVar17 == 0);
          goto LAB_01d25d17;
        }
        if (local_a0 == uVar6) {
          iVar21 = 3;
          goto LAB_01d25d13;
        }
        if (((uVar17 == 0) && (uVar22 = 3, uVar24 - 1 == uVar6)) || (uVar22 = uVar6 + 3, uVar22 < 4)
           ) goto LAB_01d25d17;
LAB_01d25d3e:
        local_90 = local_84;
        local_98 = CONCAT44(uVar24,uVar6);
        uVar14 = uVar24;
        local_a0 = local_84;
      }
      else {
LAB_01d25d17:
        uVar11 = uVar22 - (uVar17 != 0);
        uVar6 = uVar24;
        uVar14 = local_84;
        if (uVar11 != 0) {
          if (uVar11 == 3) {
            uVar6 = uVar24 - 1;
          }
          else {
            uVar6 = *(uint *)((long)&local_98 + (ulong)uVar11 * 4);
          }
          if (uVar11 == 1) {
            local_84 = local_a0;
          }
          goto LAB_01d25d3e;
        }
      }
      uVar24 = uVar6;
      if ((cctx->appliedParams).validateSequences != 0) {
        uVar7 = (ulong)(uVar17 + uVar18) + seqPos->posInSrc;
        seqPos->posInSrc = uVar7;
        uVar15 = 1L << ((byte)(cctx->appliedParams).cParams.windowLog & 0x3f);
        uVar12 = local_68 + uVar7;
        if (uVar15 < uVar7) {
          uVar12 = uVar15;
        }
        if (uVar12 + 3 < (ulong)uVar22) {
          return 0xffffffffffffff95;
        }
        if (uVar18 < 4 - ((cctx->appliedParams).cParams.minMatch == 3 ||
                         (cctx->appliedParams).extSeqProdFunc != (ZSTD_sequenceProducer_F)0x0)) {
          return 0xffffffffffffff95;
        }
      }
      if ((cctx->seqStore).maxNbSeq <= (ulong)(UVar23 - seqPos->idx)) {
        return 0xffffffffffffff95;
      }
      local_84 = uVar14;
      local_38 = uVar10;
      uVar10 = (ulong)uVar17;
      pBVar4 = (cctx->seqStore).lit;
      if (pBVar9 < (BYTE *)((long)src + uVar10)) {
        local_50 = (BYTE *)src;
        ZSTD_safecopyLiterals(pBVar4,(BYTE *)src,(BYTE *)((long)src + uVar10),pBVar9);
        src = local_50;
LAB_01d25e2b:
        ppBVar1 = &(cctx->seqStore).lit;
        *ppBVar1 = *ppBVar1 + uVar10;
        psVar8 = (cctx->seqStore).sequences;
        seqPos = local_70;
        pBVar9 = local_80;
        if (0xffff < uVar17) {
          (cctx->seqStore).longLengthType = ZSTD_llt_literalLength;
          (cctx->seqStore).longLengthPos =
               (U32)((ulong)((long)psVar8 - (long)(cctx->seqStore).sequencesStart) >> 3);
        }
      }
      else {
        uVar5 = *(undefined8 *)((long)src + 8);
        *(undefined8 *)pBVar4 = *src;
        *(undefined8 *)(pBVar4 + 8) = uVar5;
        if (0x10 < uVar17) {
          pBVar4 = (cctx->seqStore).lit;
          uVar5 = *(undefined8 *)((long)src + 0x18);
          *(undefined8 *)(pBVar4 + 0x10) = *(undefined8 *)((long)src + 0x10);
          *(undefined8 *)(pBVar4 + 0x18) = uVar5;
          if (0x10 < uVar10 - 0x10) {
            lVar16 = 0;
            do {
              uVar5 = *(undefined8 *)((BYTE *)((long)src + lVar16 + 0x20) + 8);
              pBVar9 = pBVar4 + lVar16 + 0x20;
              *(undefined8 *)pBVar9 = *(undefined8 *)((long)src + lVar16 + 0x20);
              *(undefined8 *)(pBVar9 + 8) = uVar5;
              uVar5 = *(undefined8 *)((BYTE *)((long)src + lVar16 + 0x30) + 8);
              *(undefined8 *)(pBVar9 + 0x10) = *(undefined8 *)((long)src + lVar16 + 0x30);
              *(undefined8 *)(pBVar9 + 0x18) = uVar5;
              lVar16 = lVar16 + 0x20;
            } while (pBVar9 + 0x20 < pBVar4 + uVar10);
            goto LAB_01d25e2b;
          }
        }
        ppBVar1 = &(cctx->seqStore).lit;
        *ppBVar1 = *ppBVar1 + uVar10;
        psVar8 = (cctx->seqStore).sequences;
      }
      psVar8->litLength = (U16)uVar17;
      psVar8->offBase = uVar22;
      if (0xffff < (ulong)uVar18 - 3) {
        (cctx->seqStore).longLengthType = ZSTD_llt_matchLength;
        (cctx->seqStore).longLengthPos =
             (U32)((ulong)((long)psVar8 - (long)(cctx->seqStore).sequencesStart) >> 3);
      }
      local_a8 = uVar25 - local_a8;
      src = (void *)((long)src + (ulong)(uVar18 + uVar17));
      psVar8->mlBase = (U16)((ulong)uVar18 - 3);
      (cctx->seqStore).sequences = psVar8 + 1;
      UVar23 = (UVar23 + 1) - (uint)(uVar25 < local_74);
      uVar10 = local_38;
      uVar25 = local_a8;
      iVar21 = local_88;
    } while (local_a8 != 0);
    uVar22 = 0;
    uVar14 = local_ac;
  }
LAB_01d25fb7:
  seqPos->idx = UVar23;
  seqPos->posInSequence = uVar22;
  pZVar3 = (cctx->blockState).nextCBlock;
  pZVar3->rep[2] = local_90;
  *(undefined8 *)pZVar3->rep = local_98;
  pBVar9 = (BYTE *)(local_58 - (ulong)uVar14);
  if ((BYTE *)src != pBVar9) {
    uVar10 = (ulong)(uint)((int)pBVar9 - (int)src);
    switchD_015de399::default((cctx->seqStore).lit,src,uVar10);
    ppBVar1 = &(cctx->seqStore).lit;
    *ppBVar1 = *ppBVar1 + uVar10;
    seqPos->posInSrc = seqPos->posInSrc + uVar10;
  }
  return (ulong)uVar14;
}

Assistant:

size_t
ZSTD_copySequencesToSeqStoreNoBlockDelim(ZSTD_CCtx* cctx, ZSTD_sequencePosition* seqPos,
                                   const ZSTD_Sequence* const inSeqs, size_t inSeqsSize,
                                   const void* src, size_t blockSize, ZSTD_paramSwitch_e externalRepSearch)
{
    U32 idx = seqPos->idx;
    U32 startPosInSequence = seqPos->posInSequence;
    U32 endPosInSequence = seqPos->posInSequence + (U32)blockSize;
    size_t dictSize;
    BYTE const* ip = (BYTE const*)(src);
    BYTE const* iend = ip + blockSize;  /* May be adjusted if we decide to process fewer than blockSize bytes */
    repcodes_t updatedRepcodes;
    U32 bytesAdjustment = 0;
    U32 finalMatchSplit = 0;

    /* TODO(embg) support fast parsing mode in noBlockDelim mode */
    (void)externalRepSearch;

    if (cctx->cdict) {
        dictSize = cctx->cdict->dictContentSize;
    } else if (cctx->prefixDict.dict) {
        dictSize = cctx->prefixDict.dictSize;
    } else {
        dictSize = 0;
    }
    DEBUGLOG(5, "ZSTD_copySequencesToSeqStoreNoBlockDelim: idx: %u PIS: %u blockSize: %zu", idx, startPosInSequence, blockSize);
    DEBUGLOG(5, "Start seq: idx: %u (of: %u ml: %u ll: %u)", idx, inSeqs[idx].offset, inSeqs[idx].matchLength, inSeqs[idx].litLength);
    ZSTD_memcpy(updatedRepcodes.rep, cctx->blockState.prevCBlock->rep, sizeof(repcodes_t));
    while (endPosInSequence && idx < inSeqsSize && !finalMatchSplit) {
        const ZSTD_Sequence currSeq = inSeqs[idx];
        U32 litLength = currSeq.litLength;
        U32 matchLength = currSeq.matchLength;
        U32 const rawOffset = currSeq.offset;
        U32 offBase;

        /* Modify the sequence depending on where endPosInSequence lies */
        if (endPosInSequence >= currSeq.litLength + currSeq.matchLength) {
            if (startPosInSequence >= litLength) {
                startPosInSequence -= litLength;
                litLength = 0;
                matchLength -= startPosInSequence;
            } else {
                litLength -= startPosInSequence;
            }
            /* Move to the next sequence */
            endPosInSequence -= currSeq.litLength + currSeq.matchLength;
            startPosInSequence = 0;
        } else {
            /* This is the final (partial) sequence we're adding from inSeqs, and endPosInSequence
               does not reach the end of the match. So, we have to split the sequence */
            DEBUGLOG(6, "Require a split: diff: %u, idx: %u PIS: %u",
                     currSeq.litLength + currSeq.matchLength - endPosInSequence, idx, endPosInSequence);
            if (endPosInSequence > litLength) {
                U32 firstHalfMatchLength;
                litLength = startPosInSequence >= litLength ? 0 : litLength - startPosInSequence;
                firstHalfMatchLength = endPosInSequence - startPosInSequence - litLength;
                if (matchLength > blockSize && firstHalfMatchLength >= cctx->appliedParams.cParams.minMatch) {
                    /* Only ever split the match if it is larger than the block size */
                    U32 secondHalfMatchLength = currSeq.matchLength + currSeq.litLength - endPosInSequence;
                    if (secondHalfMatchLength < cctx->appliedParams.cParams.minMatch) {
                        /* Move the endPosInSequence backward so that it creates match of minMatch length */
                        endPosInSequence -= cctx->appliedParams.cParams.minMatch - secondHalfMatchLength;
                        bytesAdjustment = cctx->appliedParams.cParams.minMatch - secondHalfMatchLength;
                        firstHalfMatchLength -= bytesAdjustment;
                    }
                    matchLength = firstHalfMatchLength;
                    /* Flag that we split the last match - after storing the sequence, exit the loop,
                       but keep the value of endPosInSequence */
                    finalMatchSplit = 1;
                } else {
                    /* Move the position in sequence backwards so that we don't split match, and break to store
                     * the last literals. We use the original currSeq.litLength as a marker for where endPosInSequence
                     * should go. We prefer to do this whenever it is not necessary to split the match, or if doing so
                     * would cause the first half of the match to be too small
                     */
                    bytesAdjustment = endPosInSequence - currSeq.litLength;
                    endPosInSequence = currSeq.litLength;
                    break;
                }
            } else {
                /* This sequence ends inside the literals, break to store the last literals */
                break;
            }
        }
        /* Check if this offset can be represented with a repcode */
        {   U32 const ll0 = (litLength == 0);
            offBase = ZSTD_finalizeOffBase(rawOffset, updatedRepcodes.rep, ll0);
            ZSTD_updateRep(updatedRepcodes.rep, offBase, ll0);
        }

        if (cctx->appliedParams.validateSequences) {
            seqPos->posInSrc += litLength + matchLength;
            FORWARD_IF_ERROR(ZSTD_validateSequence(offBase, matchLength, cctx->appliedParams.cParams.minMatch, seqPos->posInSrc,
                                                   cctx->appliedParams.cParams.windowLog, dictSize, ZSTD_hasExtSeqProd(&cctx->appliedParams)),
                                                   "Sequence validation failed");
        }
        DEBUGLOG(6, "Storing sequence: (of: %u, ml: %u, ll: %u)", offBase, matchLength, litLength);
        RETURN_ERROR_IF(idx - seqPos->idx >= cctx->seqStore.maxNbSeq, externalSequences_invalid,
                        "Not enough memory allocated. Try adjusting ZSTD_c_minMatch.");
        ZSTD_storeSeq(&cctx->seqStore, litLength, ip, iend, offBase, matchLength);
        ip += matchLength + litLength;
        if (!finalMatchSplit)
            idx++; /* Next Sequence */
    }
    DEBUGLOG(5, "Ending seq: idx: %u (of: %u ml: %u ll: %u)", idx, inSeqs[idx].offset, inSeqs[idx].matchLength, inSeqs[idx].litLength);
    assert(idx == inSeqsSize || endPosInSequence <= inSeqs[idx].litLength + inSeqs[idx].matchLength);
    seqPos->idx = idx;
    seqPos->posInSequence = endPosInSequence;
    ZSTD_memcpy(cctx->blockState.nextCBlock->rep, updatedRepcodes.rep, sizeof(repcodes_t));

    iend -= bytesAdjustment;
    if (ip != iend) {
        /* Store any last literals */
        U32 lastLLSize = (U32)(iend - ip);
        assert(ip <= iend);
        DEBUGLOG(6, "Storing last literals of size: %u", lastLLSize);
        ZSTD_storeLastLiterals(&cctx->seqStore, ip, lastLLSize);
        seqPos->posInSrc += lastLLSize;
    }

    return bytesAdjustment;
}